

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
KillDeathRatioIRCCommand::trigger
          (KillDeathRatioIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  size_type sVar8;
  pointer pPVar9;
  size_t sVar10;
  size_type sVar11;
  char *pcVar12;
  __sv_type _Var13;
  basic_string_view<char,_std::char_traits<char>_> bVar14;
  double local_1d8;
  size_t local_158;
  char *local_150;
  size_t local_138;
  char *local_130;
  char *local_118;
  char *local_110;
  string local_f8;
  undefined1 local_d8 [8];
  string playerName;
  iterator local_a8;
  undefined1 local_a0 [8];
  iterator node;
  Server *server;
  undefined4 local_7c;
  undefined1 local_78 [4];
  uint i;
  string msg;
  int type;
  Channel *chan;
  IRC_Bot *source_local;
  KillDeathRatioIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  if (bVar4) {
    bVar14 = sv("Error: Too Few Parameters. Syntax: Kills <Player>",0x31);
    local_158 = bVar14._M_len;
    local_150 = bVar14._M_str;
    Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,local_158,local_150);
  }
  else {
    lVar6 = Jupiter::IRC::Client::getChannel(source,channel._M_len,channel._M_str);
    if (lVar6 != 0) {
      msg.field_2._12_4_ = Jupiter::IRC::Client::Channel::getType();
      std::__cxx11::string::string((string *)local_78);
      local_7c = 0;
      while( true ) {
        RenX::getCore();
        local_118 = (char *)RenX::Core::getServerCount();
        if ((char *)(ulong)(uint)local_7c == local_118) break;
        uVar7 = RenX::getCore();
        node._M_node = (_List_node_base *)RenX::Core::getServer(uVar7);
        bVar5 = RenX::Server::isLogChanType((int)node._M_node);
        if (((bVar5 & 1) != 0) &&
           (sVar8 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::size
                              ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                               (node._M_node + 1)), sVar8 != 0)) {
          local_a0 = (undefined1  [8])
                     std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::begin
                               ((list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *)
                                (node._M_node + 1));
          while( true ) {
            local_a8 = std::__cxx11::list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>::end
                                 (node._M_node + 1);
            bVar4 = std::operator==((_Self *)local_a0,&stack0xffffffffffffff58);
            if (((bVar4 ^ 0xffU) & 1) == 0) break;
            pPVar9 = std::_List_iterator<RenX::PlayerInfo>::operator->
                               ((_List_iterator<RenX::PlayerInfo> *)local_a0);
            playerName.field_2._8_8_ = parameters._M_len;
            bVar14._M_str = local_118;
            bVar14._M_len = (size_t)parameters._M_str;
            sVar10 = jessilib::findi<char,char>
                               ((jessilib *)&pPVar9->name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )parameters._M_len,bVar14);
            if (sVar10 != 0xffffffffffffffff) {
              std::_List_iterator<RenX::PlayerInfo>::operator*
                        ((_List_iterator<RenX::PlayerInfo> *)local_a0);
              RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)local_d8);
              sVar11 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8);
              pcVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_d8);
              pPVar9 = std::_List_iterator<RenX::PlayerInfo>::operator->
                                 ((_List_iterator<RenX::PlayerInfo> *)local_a0);
              uVar1 = pPVar9->kills;
              pPVar9 = std::_List_iterator<RenX::PlayerInfo>::operator->
                                 ((_List_iterator<RenX::PlayerInfo> *)local_a0);
              uVar2 = pPVar9->deaths;
              pPVar9 = std::_List_iterator<RenX::PlayerInfo>::operator->
                                 ((_List_iterator<RenX::PlayerInfo> *)local_a0);
              uVar3 = pPVar9->kills;
              pPVar9 = std::_List_iterator<RenX::PlayerInfo>::operator->
                                 ((_List_iterator<RenX::PlayerInfo> *)local_a0);
              if (pPVar9->deaths == 0) {
                local_1d8 = 1.0;
              }
              else {
                pPVar9 = std::_List_iterator<RenX::PlayerInfo>::operator->
                                   ((_List_iterator<RenX::PlayerInfo> *)local_a0);
                local_1d8 = (double)pPVar9->deaths;
              }
              string_printf_abi_cxx11_
                        (&local_f8,"\x02%.*s\x02\x03: Kills: %u - Deaths: %u - KDR: %.2f",
                         SUB84((double)uVar3 / local_1d8,0),sVar11,pcVar12,(ulong)uVar1,(ulong)uVar2
                        );
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_78,&local_f8);
              std::__cxx11::string::~string((string *)&local_f8);
              _Var13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_78);
              local_118 = (char *)_Var13._M_len;
              local_110 = _Var13._M_str;
              Jupiter::IRC::Client::sendMessage
                        (source,channel._M_len,channel._M_str,local_118,local_110);
              std::__cxx11::string::~string((string *)local_d8);
            }
            std::_List_iterator<RenX::PlayerInfo>::operator++
                      ((_List_iterator<RenX::PlayerInfo> *)local_a0);
          }
        }
        local_7c = local_7c + 1;
      }
      bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_78);
      if (bVar4) {
        bVar14 = sv("Error: Player not found.",0x18);
        local_138 = bVar14._M_len;
        local_130 = bVar14._M_str;
        Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,local_138,local_130);
      }
      std::__cxx11::string::~string((string *)local_78);
    }
  }
  return;
}

Assistant:

void KillDeathRatioIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string msg;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, parameters) != std::string::npos) {
							std::string playerName = RenX::getFormattedPlayerName(*node);
							msg = string_printf(IRCBOLD "%.*s" IRCBOLD IRCCOLOR ": Kills: %u - Deaths: %u - KDR: %.2f", playerName.size(),
								playerName.data(), node->kills, node->deaths, static_cast<double>(node->kills) / (node->deaths == 0 ? 1.0f : static_cast<double>(node->deaths)));
							source->sendMessage(channel, msg);
						}
					}
				}
			}
			if (msg.empty())
				source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: Kills <Player>"sv);
}